

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

bool glcts::verifyImage<unsigned_int,4u>
               (GLuint image_width,GLuint image_height,uint *components,uint *image)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  bool local_41;
  
  local_41 = image_height == 0;
  if (!local_41) {
    uVar5 = 0;
    uVar2 = 0;
    do {
      iVar4 = (int)uVar5;
      if (image_width != 0) {
        uVar6 = 0;
        do {
          if (image[(uVar2 * image_width + (int)uVar6) * 4] == *components) {
            uVar1 = 0;
            do {
              uVar3 = uVar1;
              if (uVar3 == 3) {
                iVar7 = 0;
                goto LAB_00d6fe1a;
              }
              uVar1 = uVar3 + 1;
            } while (image[uVar5 + uVar3 + 1] == components[uVar3 + 1]);
            iVar7 = 1;
LAB_00d6fe1a:
            bVar8 = 2 < uVar3;
          }
          else {
            iVar7 = 1;
            bVar8 = false;
          }
          if (!bVar8) goto LAB_00d6fe39;
          uVar6 = uVar6 + 1;
          uVar5 = (ulong)((int)uVar5 + 4);
        } while (uVar6 != image_width);
      }
      iVar7 = 5;
LAB_00d6fe39:
      if ((iVar7 != 5) && (iVar7 != 0)) {
        return local_41;
      }
      uVar2 = uVar2 + 1;
      uVar5 = (ulong)(iVar4 + image_width * 4);
      local_41 = image_height <= uVar2;
    } while (uVar2 != image_height);
  }
  return local_41;
}

Assistant:

bool verifyImage(glw::GLuint image_width, glw::GLuint image_height, const T* components, const T* image)
{
	const glw::GLuint line_size = image_width * N_Components;

	for (glw::GLuint y = 0; y < image_height; ++y)
	{
		const glw::GLuint line_offset = y * line_size;

		for (glw::GLuint x = 0; x < image_width; ++x)
		{
			const glw::GLuint pixel_offset = line_offset + x * N_Components;

			for (glw::GLuint component = 0; component < N_Components; ++component)
			{
				if (image[pixel_offset + component] != components[component])
				{
					return false;
				}
			} /* for (all components) */
		}	 /* for (all columns) */
	}		  /* for (all rows) */

	return true;
}